

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O3

int16 * acmod_score(acmod_t *acmod,int *inout_frame_idx)

{
  uint uVar1;
  int iVar2;
  int16 *piVar3;
  int iVar4;
  
  if (inout_frame_idx == (int *)0x0) {
    iVar4 = acmod->output_frame;
  }
  else {
    iVar4 = *inout_frame_idx;
    if (iVar4 < 0) {
      iVar4 = iVar4 + acmod->output_frame + 1;
    }
  }
  if (((acmod->compallsen == '\0') && (acmod->insenfh == (FILE *)0x0)) ||
     (iVar4 != acmod->senscr_frame)) {
    uVar1 = calc_feat_idx(acmod,iVar4);
    if (-1 < (int)uVar1) {
      if ((FILE *)acmod->insenfh == (FILE *)0x0) {
        acmod_flags2list(acmod);
        (*acmod->mgau->vt->frame_eval)
                  (acmod->mgau,acmod->senone_scores,acmod->senone_active,acmod->n_senone_active,
                   acmod->feat_buf[uVar1],iVar4,(int32)acmod->compallsen);
      }
      else {
        fseek((FILE *)acmod->insenfh,acmod->framepos[uVar1],0);
        iVar2 = acmod_read_scores_internal(acmod);
        if (iVar2 < 0) {
          return (int16 *)0x0;
        }
      }
      if (inout_frame_idx != (int *)0x0) {
        *inout_frame_idx = iVar4;
      }
      acmod->senscr_frame = iVar4;
      if ((acmod->senfh == (FILE *)0x0) ||
         (iVar4 = acmod_write_scores(acmod,acmod->n_senone_active,acmod->senone_active,
                                     acmod->senone_scores,acmod->senfh), -1 < iVar4))
      goto LAB_0011ee75;
    }
    piVar3 = (int16 *)0x0;
  }
  else {
    if (inout_frame_idx != (int *)0x0) {
      *inout_frame_idx = iVar4;
    }
LAB_0011ee75:
    piVar3 = acmod->senone_scores;
  }
  return piVar3;
}

Assistant:

int16 const *
acmod_score(acmod_t *acmod, int *inout_frame_idx)
{
    int frame_idx, feat_idx;

    /* Calculate the absolute frame index to be scored. */
    frame_idx = calc_frame_idx(acmod, inout_frame_idx);

    /* If all senones are being computed, or we are using a senone file,
       then we can reuse existing scores. */
    if ((acmod->compallsen || acmod->insenfh)
        && frame_idx == acmod->senscr_frame) {
        if (inout_frame_idx)
            *inout_frame_idx = frame_idx;
        return acmod->senone_scores;
    }

    /* Calculate position of requested frame in circular buffer. */
    if ((feat_idx = calc_feat_idx(acmod, frame_idx)) < 0)
        return NULL;

    /* If there is an input senone file locate the appropriate frame and read it. */
    if (acmod->insenfh) {
        fseek(acmod->insenfh, acmod->framepos[feat_idx], SEEK_SET);
        if (acmod_read_scores_internal(acmod) < 0)
            return NULL;
    }
    else {
        /* Build active senone list. */
        acmod_flags2list(acmod);

        /* Generate scores for the next available frame */
        ps_mgau_frame_eval(acmod->mgau,
                           acmod->senone_scores,
                           acmod->senone_active,
                           acmod->n_senone_active,
                           acmod->feat_buf[feat_idx],
                           frame_idx,
                           acmod->compallsen);
    }

    if (inout_frame_idx)
        *inout_frame_idx = frame_idx;
    acmod->senscr_frame = frame_idx;

    /* Dump scores to the senone dump file if one exists. */
    if (acmod->senfh) {
        if (acmod_write_scores(acmod, acmod->n_senone_active,
                               acmod->senone_active,
                               acmod->senone_scores,
                               acmod->senfh) < 0)
            return NULL;
        E_DEBUG("Frame %d has %d active states\n", frame_idx,
                acmod->n_senone_active);
    }

    return acmod->senone_scores;
}